

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblob.cpp
# Opt level: O0

SQUserPointer sqstd_createblob(HSQUIRRELVM v,SQInteger size)

{
  HSQUIRRELVM v_00;
  SQRESULT SVar1;
  SQUserPointer pvVar2;
  HSQUIRRELVM in_RSI;
  HSQUIRRELVM in_RDI;
  SQBlob *blob;
  SQInteger top;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  SQBlob *in_stack_ffffffffffffffd8;
  SQBool in_stack_fffffffffffffff8;
  
  v_00 = (HSQUIRRELVM)sq_gettop(in_RDI);
  sq_pushregistrytable((HSQUIRRELVM)0x1401e7);
  sq_pushstring((HSQUIRRELVM)size,(SQChar *)top,(SQInteger)blob);
  SVar1 = sq_get(in_RSI,(SQInteger)v_00);
  if (-1 < SVar1) {
    sq_remove(v_00,(SQInteger)in_stack_ffffffffffffffd8);
    sq_push(v_00,(SQInteger)in_stack_ffffffffffffffd8);
    sq_pushinteger((HSQUIRRELVM)size,top);
    in_stack_ffffffffffffffd8 = (SQBlob *)0x0;
    SVar1 = sq_call(in_stack_00000028,in_stack_00000020,(SQBool)v,size);
    if ((-1 < SVar1) &&
       (SVar1 = sq_getinstanceup(v,size,(SQUserPointer *)top,blob,in_stack_fffffffffffffff8),
       -1 < SVar1)) {
      sq_remove(v_00,(SQInteger)in_stack_ffffffffffffffd8);
      pvVar2 = SQBlob::GetBuf(in_stack_ffffffffffffffd8);
      return pvVar2;
    }
  }
  sq_settop(v_00,(SQInteger)in_stack_ffffffffffffffd8);
  return (SQUserPointer)0x0;
}

Assistant:

SQUserPointer sqstd_createblob(HSQUIRRELVM v, SQInteger size)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_blob"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_push(v,1); // push the this
        sq_pushinteger(v,size); //size
        SQBlob *blob = NULL;
        if(SQ_SUCCEEDED(sq_call(v,2,SQTrue,SQFalse))
            && SQ_SUCCEEDED(sq_getinstanceup(v,-1,(SQUserPointer *)&blob,(SQUserPointer)SQSTD_BLOB_TYPE_TAG,SQTrue))) {
            sq_remove(v,-2);
            return blob->GetBuf();
        }
    }
    sq_settop(v,top);
    return NULL;
}